

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::setPose(btSoftBody *this,bool bvolume,bool bframe)

{
  int iVar1;
  btMatrix3x3 *this_00;
  Node *pNVar2;
  float *pfVar3;
  btAlignedObjectArray<btVector3> *this_01;
  btVector3 *pbVar4;
  btVector3 *pbVar5;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  btScalar bVar6;
  float fVar7;
  btVector3 mq;
  btVector3 *q;
  btVector3 com;
  Node *n;
  btScalar tmass;
  btScalar kmass;
  btScalar omass;
  int ni;
  int i;
  btMatrix3x3 *in_stack_fffffffffffffeb8;
  btSoftBody *in_stack_fffffffffffffec0;
  btVector3 *in_stack_fffffffffffffec8;
  btSoftBody *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffedc;
  btAlignedObjectArray<float> *in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffef0;
  btSoftBody *in_stack_ffffffffffffff30;
  btVector3 local_c8;
  btVector3 local_b8;
  btVector3 local_a8;
  btScalar local_98 [4];
  btVector3 *local_88;
  btScalar local_7c;
  btScalar local_78;
  btScalar local_74;
  btVector3 local_70;
  btVector3 local_60;
  btVector3 local_50;
  btVector3 local_40;
  Node *local_30;
  btScalar local_24;
  btScalar local_20;
  float local_1c;
  btScalar local_18;
  btScalar local_14;
  btScalar local_10;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  *(byte *)(in_RDI + 600) = local_9;
  *(byte *)(in_RDI + 0x259) = local_a;
  bVar6 = getTotalMass(in_stack_fffffffffffffed0);
  local_18 = bVar6;
  iVar1 = btAlignedObjectArray<btSoftBody::Node>::size
                    ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
  local_1c = bVar6 * (float)iVar1 * 1000.0;
  local_20 = local_18;
  this_00 = (btMatrix3x3 *)(in_RDI + 0x280);
  btAlignedObjectArray<btSoftBody::Node>::size
            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
  local_24 = 0.0;
  btAlignedObjectArray<float>::resize
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,(float *)in_stack_fffffffffffffed0)
  ;
  local_10 = 0.0;
  local_14 = (btScalar)
             btAlignedObjectArray<btSoftBody::Node>::size
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
  for (; (int)local_10 < (int)local_14; local_10 = (btScalar)((int)local_10 + 1)) {
    pNVar2 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),(int)local_10);
    if (pNVar2->m_im <= 0.0) {
      local_20 = local_1c + local_20;
    }
  }
  local_10 = 0.0;
  local_14 = (btScalar)
             btAlignedObjectArray<btSoftBody::Node>::size
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
  for (; (int)local_10 < (int)local_14; local_10 = (btScalar)((int)local_10 + 1)) {
    local_30 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),(int)local_10);
    if (local_30->m_im <= 0.0) {
      fVar7 = local_1c / local_20;
    }
    else {
      pNVar2 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),(int)local_10);
      fVar7 = 1.0 / (pNVar2->m_im * local_20);
    }
    in_stack_fffffffffffffef0 = fVar7;
    pfVar3 = btAlignedObjectArray<float>::operator[]
                       ((btAlignedObjectArray<float> *)(in_RDI + 0x280),(int)local_10);
    *pfVar3 = fVar7;
  }
  local_40 = evaluateCom((btSoftBody *)CONCAT44(bVar6,in_stack_fffffffffffffef0));
  this_01 = (btAlignedObjectArray<btVector3> *)(in_RDI + 0x260);
  btAlignedObjectArray<btSoftBody::Node>::size
            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
  btVector3::btVector3(&local_50);
  btAlignedObjectArray<btVector3>::resize
            (this_01,in_stack_fffffffffffffedc,(btVector3 *)in_stack_fffffffffffffed0);
  local_10 = 0.0;
  local_14 = (btScalar)
             btAlignedObjectArray<btSoftBody::Node>::size
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
  for (; (int)local_10 < (int)local_14; local_10 = (btScalar)((int)local_10 + 1)) {
    btAlignedObjectArray<btSoftBody::Node>::operator[]
              ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),(int)local_10);
    local_60 = operator-((btVector3 *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    pbVar4 = btAlignedObjectArray<btVector3>::operator[]
                       ((btAlignedObjectArray<btVector3> *)(in_RDI + 0x260),(int)local_10);
    *(undefined8 *)pbVar4->m_floats = local_60.m_floats._0_8_;
    *(undefined8 *)(pbVar4->m_floats + 2) = local_60.m_floats._8_8_;
  }
  if ((local_9 & 1) == 0) {
    bVar6 = 0.0;
  }
  else {
    bVar6 = getVolume(in_stack_ffffffffffffff30);
  }
  *(btScalar *)(in_RDI + 0x25c) = bVar6;
  *(undefined8 *)(in_RDI + 0x2a0) = local_40.m_floats._0_8_;
  *(undefined8 *)(in_RDI + 0x2a8) = local_40.m_floats._8_8_;
  btMatrix3x3::setIdentity(this_00);
  btMatrix3x3::setIdentity(this_00);
  local_74 = 0.0;
  local_78 = 0.0;
  local_7c = 0.0;
  btVector3::btVector3(&local_70,&local_74,&local_78,&local_7c);
  pbVar4 = btMatrix3x3::operator[]((btMatrix3x3 *)(in_RDI + 0x310),2);
  *(undefined8 *)pbVar4->m_floats = local_70.m_floats._0_8_;
  *(undefined8 *)(pbVar4->m_floats + 2) = local_70.m_floats._8_8_;
  pbVar5 = btMatrix3x3::operator[]((btMatrix3x3 *)(in_RDI + 0x310),1);
  *(undefined8 *)pbVar5->m_floats = *(undefined8 *)pbVar4->m_floats;
  *(undefined8 *)(pbVar5->m_floats + 2) = *(undefined8 *)(pbVar4->m_floats + 2);
  pbVar4 = btMatrix3x3::operator[]((btMatrix3x3 *)(in_RDI + 0x310),0);
  *(undefined8 *)pbVar4->m_floats = *(undefined8 *)pbVar5->m_floats;
  *(undefined8 *)(pbVar4->m_floats + 2) = *(undefined8 *)(pbVar5->m_floats + 2);
  local_10 = 0.0;
  local_14 = (btScalar)
             btAlignedObjectArray<btSoftBody::Node>::size
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
  for (; (int)local_10 < (int)local_14; local_10 = (btScalar)((int)local_10 + 1)) {
    local_88 = btAlignedObjectArray<btVector3>::operator[]
                         ((btAlignedObjectArray<btVector3> *)(in_RDI + 0x260),(int)local_10);
    btAlignedObjectArray<float>::operator[]
              ((btAlignedObjectArray<float> *)(in_RDI + 0x280),(int)local_10);
    local_98 = (btScalar  [4])
               ::operator*((btScalar *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8->m_el);
    in_stack_fffffffffffffec0 = (btSoftBody *)local_98;
    btVector3::x((btVector3 *)in_stack_fffffffffffffec0);
    local_a8 = ::operator*((btScalar *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8->m_el);
    in_stack_fffffffffffffeb8 = (btMatrix3x3 *)(in_RDI + 0x310);
    pbVar4 = btMatrix3x3::operator[](in_stack_fffffffffffffeb8,0);
    btVector3::operator+=(pbVar4,&local_a8);
    btVector3::y((btVector3 *)in_stack_fffffffffffffec0);
    local_b8 = ::operator*((btScalar *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8->m_el);
    pbVar4 = btMatrix3x3::operator[](in_stack_fffffffffffffeb8,1);
    btVector3::operator+=(pbVar4,&local_b8);
    btVector3::z((btVector3 *)in_stack_fffffffffffffec0);
    local_c8 = ::operator*((btScalar *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8->m_el);
    pbVar4 = btMatrix3x3::operator[]((btMatrix3x3 *)(in_RDI + 0x310),2);
    btVector3::operator+=(pbVar4,&local_c8);
  }
  btMatrix3x3::inverse((btMatrix3x3 *)in_stack_ffffffffffffff30);
  btMatrix3x3::operator=((btMatrix3x3 *)(in_RDI + 0x310),(btMatrix3x3 *)&stack0xffffffffffffff08);
  updateConstants(in_stack_fffffffffffffec0);
  return;
}

Assistant:

void			btSoftBody::setPose(bool bvolume,bool bframe)
{
	m_pose.m_bvolume	=	bvolume;
	m_pose.m_bframe		=	bframe;
	int i,ni;

	/* Weights		*/ 
	const btScalar	omass=getTotalMass();
	const btScalar	kmass=omass*m_nodes.size()*1000;
	btScalar		tmass=omass;
	m_pose.m_wgh.resize(m_nodes.size());
	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		if(m_nodes[i].m_im<=0) tmass+=kmass;
	}
	for( i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		m_pose.m_wgh[i]=	n.m_im>0					?
			1/(m_nodes[i].m_im*tmass)	:
		kmass/tmass;
	}
	/* Pos		*/ 
	const btVector3	com=evaluateCom();
	m_pose.m_pos.resize(m_nodes.size());
	for( i=0,ni=m_nodes.size();i<ni;++i)
	{
		m_pose.m_pos[i]=m_nodes[i].m_x-com;
	}
	m_pose.m_volume	=	bvolume?getVolume():0;
	m_pose.m_com	=	com;
	m_pose.m_rot.setIdentity();
	m_pose.m_scl.setIdentity();
	/* Aqq		*/ 
	m_pose.m_aqq[0]	=
		m_pose.m_aqq[1]	=
		m_pose.m_aqq[2]	=	btVector3(0,0,0);
	for( i=0,ni=m_nodes.size();i<ni;++i)
	{
		const btVector3&	q=m_pose.m_pos[i];
		const btVector3		mq=m_pose.m_wgh[i]*q;
		m_pose.m_aqq[0]+=mq.x()*q;
		m_pose.m_aqq[1]+=mq.y()*q;
		m_pose.m_aqq[2]+=mq.z()*q;
	}
	m_pose.m_aqq=m_pose.m_aqq.inverse();
	
	updateConstants();
}